

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O3

shared_ptr<Face> __thiscall Pyraminx::get_opposite_face(Pyraminx *this,Corner corner)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  undefined4 in_EDX;
  uint *puVar3;
  undefined4 in_register_00000034;
  shared_ptr<Face> sVar4;
  shared_ptr<Face> sVar5;
  
  puVar3 = &switchD_00106124::switchdataD_001090d0;
  switch(in_EDX) {
  case 0:
    (this->face_list).
    super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)(CONCAT44(in_register_00000034,corner) + 0x48);
    psVar2 = *(pointer *)(CONCAT44(in_register_00000034,corner) + 0x50);
    break;
  case 1:
    (this->face_list).
    super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)(CONCAT44(in_register_00000034,corner) + 0x38);
    psVar2 = *(pointer *)(CONCAT44(in_register_00000034,corner) + 0x40);
    break;
  case 2:
    (this->face_list).
    super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)(CONCAT44(in_register_00000034,corner) + 0x28);
    psVar2 = *(pointer *)(CONCAT44(in_register_00000034,corner) + 0x30);
    break;
  default:
    (this->face_list).
    super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)(CONCAT44(in_register_00000034,corner) + 0x18);
    psVar2 = *(pointer *)(CONCAT44(in_register_00000034,corner) + 0x20);
  }
  (this->face_list).
  super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
  super__Vector_impl_data._M_finish = psVar2;
  if (psVar2 != (pointer)0x0) {
    puVar3 = (uint *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1 = &(psVar2->super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      sVar4.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar4.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (shared_ptr<Face>)sVar4.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1 = &(psVar2->super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    UNLOCK();
  }
  sVar5.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3;
  sVar5.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Face>)sVar5.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Face> Pyraminx::get_opposite_face(Corner corner){
    switch (corner)
    {
    case Corner::U:
        return green_face;
        break;
    case Corner::L:
        return yellow_face;
        break;
    case Corner::R:
        return red_face;
        break;
    case Corner::B:
        return blue_face;
        break;
    default:
        return blue_face;
        printf("Invalid corner specified.\n");
        break;
    }
}